

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O2

size_t serialize_string(char *buf,uint length,char *str)

{
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  
  uVar3 = 0;
  pcVar2 = buf;
  do {
    if (length == uVar3) {
      return (long)pcVar2 - (long)buf;
    }
    cVar1 = str[uVar3];
    switch(cVar1) {
    case '\b':
      pcVar2[0] = '\\';
      pcVar2[1] = 'b';
      break;
    case '\t':
      pcVar2[0] = '\\';
      pcVar2[1] = 't';
      break;
    case '\n':
      pcVar2[0] = '\\';
      pcVar2[1] = 'n';
      break;
    case '\v':
switchD_0010d457_caseD_b:
      *pcVar2 = cVar1;
      pcVar2 = pcVar2 + 1;
      goto LAB_0010d4a1;
    case '\f':
      pcVar2[0] = '\\';
      pcVar2[1] = 'f';
      break;
    case '\r':
      pcVar2[0] = '\\';
      pcVar2[1] = 'r';
      break;
    default:
      if (cVar1 == '\\') {
        pcVar2[0] = '\\';
        pcVar2[1] = '\\';
      }
      else {
        if (cVar1 != '\"') goto switchD_0010d457_caseD_b;
        pcVar2[0] = '\\';
        pcVar2[1] = '\"';
      }
    }
    pcVar2 = pcVar2 + 2;
LAB_0010d4a1:
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

static size_t serialize_string(char *buf,
                               unsigned int length,
                               const char *str)
{
   char *orig_buf = buf;
   unsigned int i;

   for(i = 0; i < length; ++ i)
   {
      int c = str [i];

      switch (c)
      {
      case '"':   PRINT_ESCAPED ('\"');  continue;
      case '\\':  PRINT_ESCAPED ('\\');  continue;
      case '\b':  PRINT_ESCAPED ('b');   continue;
      case '\f':  PRINT_ESCAPED ('f');   continue;
      case '\n':  PRINT_ESCAPED ('n');   continue;
      case '\r':  PRINT_ESCAPED ('r');   continue;
      case '\t':  PRINT_ESCAPED ('t');   continue;

      default:

         *buf ++ = c;
         break;
      };
   };

   return buf - orig_buf;
}